

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_moria(chunk *c,loc_conflict centre,wchar_t rating)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  wchar_t *pwVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  bool bVar14;
  wchar_t width;
  wchar_t wVar15;
  loc_conflict centre_local;
  
  wVar11 = c->depth;
  centre_local = centre;
  uVar3 = Rand_div(0x23);
  uVar4 = Rand_div(5);
  wVar10 = uVar4 + L'\b';
  uVar4 = Rand_div(5);
  width = uVar4 + L'\n';
  bVar14 = true;
  do {
    if ((bVar14) && (uVar4 = Rand_div(0xf), uVar4 == 0)) {
      uVar4 = Rand_div(2);
      wVar10 = wVar10 * (uVar4 + 2);
      uVar4 = Rand_div(3);
      iVar5 = uVar4 + 3;
LAB_00157c0b:
      width = width * iVar5;
    }
    else {
      uVar4 = Rand_div(4);
      if (uVar4 != 0) {
        uVar4 = Rand_div(0xf);
        if (uVar4 != 0) {
          uVar4 = Rand_div(3);
          iVar5 = uVar4 + 2;
          goto LAB_00157c0b;
        }
        uVar4 = Rand_div(2);
        wVar10 = wVar10 * (uVar4 + 2);
      }
    }
    if (((centre_local.y < c->height) && (centre_local.x < c->width)) ||
       (_Var2 = find_space(&centre_local,wVar10,width), _Var2)) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar10,width);
      wVar13 = centre_local.y - wVar10 / 2;
      wVar15 = centre_local.x - width / 2;
      wVar9 = wVar13 + wVar10 + L'\xffffffff';
      wVar12 = width + L'\xffffffff' + wVar15;
      _Var2 = generate_starburst_room
                        (c,wVar13,wVar15,wVar9,wVar12,wVar11 <= uVar3 + L'\x01',FEAT_FLOOR,true);
      if (!_Var2) {
        return false;
      }
      uVar3 = Rand_div(0x14);
      if (uVar3 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
        wVar11 = wVar10 + L'\x03';
        if (L'\xffffffff' < wVar10) {
          wVar11 = wVar10;
        }
        uVar3 = Rand_div(wVar11 >> 2);
        wVar13 = wVar13 + uVar3;
        wVar10 = width + L'\x03';
        if (L'\xffffffff' < width) {
          wVar10 = width;
        }
        uVar3 = Rand_div(wVar10 >> 2);
        wVar15 = wVar15 + uVar3;
        uVar3 = Rand_div(wVar11 >> 2);
        wVar9 = wVar9 - uVar3;
        uVar3 = Rand_div(wVar10 >> 2);
        wVar12 = wVar12 - uVar3;
        pwVar8 = &FEAT_PASS_RUBBLE;
      }
      else {
        uVar3 = Rand_div(0x32);
        if (uVar3 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
          wVar11 = wVar10 + L'\x03';
          if (L'\xffffffff' < wVar10) {
            wVar11 = wVar10;
          }
          uVar3 = Rand_div(wVar11 >> 2);
          wVar13 = wVar13 + uVar3;
          wVar10 = width + L'\x03';
          if (L'\xffffffff' < width) {
            wVar10 = width;
          }
          uVar3 = Rand_div(wVar10 >> 2);
          wVar15 = wVar15 + uVar3;
          uVar3 = Rand_div(wVar11 >> 2);
          wVar9 = wVar9 - uVar3;
          uVar3 = Rand_div(wVar10 >> 2);
          wVar12 = wVar12 - uVar3;
          pwVar8 = &FEAT_TREE;
        }
        else {
          uVar3 = Rand_div(0x32);
          if (uVar3 != 0) {
            uVar3 = Rand_div(10);
            if (uVar3 == 0) {
              event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"water");
              wVar11 = wVar10 + L'\x03';
              if (L'\xffffffff' < wVar10) {
                wVar11 = wVar10;
              }
              uVar3 = Rand_div(wVar11 >> 2);
              wVar10 = width + L'\x03';
              if (L'\xffffffff' < width) {
                wVar10 = width;
              }
              uVar4 = Rand_div(wVar10 >> 2);
              uVar6 = Rand_div(wVar11 >> 2);
              uVar7 = Rand_div(wVar10 >> 2);
              generate_starburst_room
                        (c,wVar13 + uVar3,wVar15 + uVar4,wVar9 - uVar6,wVar12 - uVar7,false,
                         FEAT_WATER,false);
              return true;
            }
            return true;
          }
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
          wVar11 = wVar10 + L'\x03';
          if (L'\xffffffff' < wVar10) {
            wVar11 = wVar10;
          }
          uVar3 = Rand_div(wVar11 >> 2);
          wVar13 = wVar13 + uVar3;
          wVar10 = width + L'\x03';
          if (L'\xffffffff' < width) {
            wVar10 = width;
          }
          uVar3 = Rand_div(wVar10 >> 2);
          wVar15 = wVar15 + uVar3;
          uVar3 = Rand_div(wVar11 >> 2);
          wVar9 = wVar9 - uVar3;
          uVar3 = Rand_div(wVar10 >> 2);
          wVar12 = wVar12 - uVar3;
          pwVar8 = &FEAT_TREE2;
        }
      }
      generate_starburst_room(c,wVar13,wVar15,wVar9,wVar12,false,*pwVar8,false);
      return true;
    }
    bVar1 = !bVar14;
    bVar14 = false;
    if (bVar1) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar10,width);
      return false;
    }
  } while( true );
}

Assistant:

bool build_moria(struct chunk *c, struct loc centre, int rating)
{
	int y1, x1, y2, x2;
	int i;
	int height, width;

	bool light = c->depth <= randint1(35);

	/* Pick a room size */
	height = 8 + randint0(5);
	width = 10 + randint0(5);


	/* Try twice to find space for a room. */
	for (i = 0; i < 2; i++) {
		/* Really large room - only on first try. */
		if ((i == 0) && one_in_(15)) {
			height *= 1 + randint1(2);
			width *= 2 + randint1(3);
		}

		/* Long, narrow room.  Sometimes tall and thin. */
		else if (!one_in_(4)) {
			if (one_in_(15))
				height *= 2 + randint0(2);
			else
				width *= 2 + randint0(3);
		}

		/* Find and reserve some space in the dungeon.  Get center of room. */
		if ((centre.y >= c->height) || (centre.x >= c->width)) {
			if (!find_space(&centre, height, width)) {
				if (i == 0) continue;  /* Failed first attempt */
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				if (i == 1) return (false);  /* Failed second attempt */
			} else {
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				break;  /* Success */
			}
		} else {
			event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
				height, width);
			break;   /* Not finding space */
		}
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;


	/* Generate starburst room.  Return immediately if out of bounds. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, true)) {
		return (false);
	}

	/* Sometimes, the room may have rubble, trees or water in it. */
	if (one_in_(20)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_PASS_RUBBLE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE2, false);
	} else if (one_in_(10)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "water");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_WATER, false);
	}

	/* Success */
	return (true);
}